

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_output.cpp
# Opt level: O0

void __thiscall Clasp::Cli::JsonOutput::printSummary(JsonOutput *this,Summary *run,bool final)

{
  byte bVar1;
  bool bVar2;
  uint32 uVar3;
  char *pcVar4;
  SumVec *pSVar5;
  SharedContext *pSVar6;
  byte in_DL;
  Summary *in_RSI;
  JsonOutput *in_RDI;
  Summary *in_stack_00000008;
  char *res;
  UPair *in_stack_ffffffffffffff88;
  JsonOutput *in_stack_ffffffffffffff90;
  Summary *in_stack_ffffffffffffff98;
  SumVec *in_stack_ffffffffffffffa8;
  JsonOutput *in_stack_ffffffffffffffb0;
  UPair local_38 [2];
  UPair in_stack_ffffffffffffffd8;
  char *this_00;
  undefined7 in_stack_ffffffffffffffe8;
  JsonOutput *this_01;
  
  bVar1 = in_DL & 1;
  this_01 = in_RDI;
  popUntil(in_stack_ffffffffffffff90,(uint32)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  this_00 = "UNKNOWN";
  bVar2 = ClaspFacade::Summary::unsat((Summary *)0x15528f);
  if (bVar2) {
    this_00 = "UNSATISFIABLE";
  }
  else {
    bVar2 = ClaspFacade::Summary::sat((Summary *)0x1552ad);
    if (bVar2) {
      bVar2 = ClaspFacade::Summary::optimum((Summary *)in_RDI);
      this_00 = "OPTIMUM FOUND";
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        this_00 = "SATISFIABLE";
      }
    }
  }
  printKeyValue(in_RDI,(char *)in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90);
  uVar3 = Output::verbosity(&in_RDI->super_Output);
  if (uVar3 != 0) {
    bVar2 = SolveResult::interrupted(&in_RSI->result);
    if (bVar2) {
      printKeyValue(in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,0);
    }
    pushObject(in_RDI,(char *)in_stack_ffffffffffffff98,
               (ObjType)((ulong)in_stack_ffffffffffffff90 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff90 >> 0x18,0));
    printKeyValue(in_RDI,(char *)in_stack_ffffffffffffff98,(uint64)in_stack_ffffffffffffff90);
    ClaspFacade::Summary::complete((Summary *)0x155381);
    printKeyValue(in_RDI,(char *)in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90);
    bVar2 = ClaspFacade::Summary::sat((Summary *)0x1553b3);
    if (bVar2) {
      pcVar4 = ClaspFacade::Summary::consequences((Summary *)in_stack_ffffffffffffff90);
      if (pcVar4 != (char *)0x0) {
        in_stack_ffffffffffffff90 =
             (JsonOutput *)ClaspFacade::Summary::consequences((Summary *)in_stack_ffffffffffffff90);
        ClaspFacade::Summary::complete((Summary *)0x1553e9);
        printKeyValue(in_RDI,(char *)in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90);
        pSVar6 = ClaspFacade::Summary::ctx(in_RSI);
        in_stack_ffffffffffffff98 = (Summary *)&pSVar6->output;
        ClaspFacade::Summary::model((Summary *)in_stack_ffffffffffffff90);
        in_stack_ffffffffffffffd8 =
             Output::numCons(&this_01->super_Output,(OutputTable *)in_RSI,
                             (Model *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
        printCons(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
      bVar2 = ClaspFacade::Summary::optimize(in_stack_ffffffffffffff98);
      if (bVar2) {
        ClaspFacade::Summary::optimum((Summary *)in_RDI);
        printKeyValue(in_RDI,(char *)in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90);
        ClaspFacade::Summary::optimal(in_RSI);
        printKeyValue(in_RDI,(char *)in_stack_ffffffffffffff98,(uint64)in_stack_ffffffffffffff90);
        ClaspFacade::Summary::costs((Summary *)in_stack_ffffffffffffff90);
        printCosts(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(char *)in_RDI);
      }
    }
    popObject(in_stack_ffffffffffffffb0);
    bVar2 = ClaspFacade::Summary::hasLower((Summary *)in_RDI);
    if ((bVar2) && (bVar2 = ClaspFacade::Summary::optimum((Summary *)in_RDI), !bVar2)) {
      pushObject(in_RDI,(char *)in_stack_ffffffffffffff98,
                 (ObjType)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                 SUB81((ulong)in_stack_ffffffffffffff90 >> 0x18,0));
      in_stack_ffffffffffffff88 = local_38;
      ClaspFacade::Summary::lower(in_stack_00000008);
      printCosts(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(char *)in_RDI);
      bk_lib::pod_vector<long,_std::allocator<long>_>::~pod_vector
                ((pod_vector<long,_std::allocator<long>_> *)0x15554a);
      pSVar5 = ClaspFacade::Summary::costs((Summary *)in_stack_ffffffffffffff90);
      if (pSVar5 == (SumVec *)0x0) {
        bk_lib::pod_vector<long,_std::allocator<long>_>::pod_vector
                  ((pod_vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffffb0);
      }
      else {
        ClaspFacade::Summary::costs((Summary *)in_stack_ffffffffffffff90);
        bk_lib::pod_vector<long,_std::allocator<long>_>::pod_vector
                  ((pod_vector<long,_std::allocator<long>_> *)this_00,
                   (pod_vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffffd8);
      }
      printCosts(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(char *)in_RDI);
      bk_lib::pod_vector<long,_std::allocator<long>_>::~pod_vector
                ((pod_vector<long,_std::allocator<long>_> *)0x15559f);
      popObject(in_stack_ffffffffffffffb0);
    }
    if ((bVar1 & 1) != 0) {
      printKeyValue(in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,0);
    }
    pushObject(in_RDI,(char *)in_stack_ffffffffffffff98,
               (ObjType)((ulong)in_stack_ffffffffffffff90 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff90 >> 0x18,0));
    printKeyValue(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,(double)in_RDI);
    printKeyValue(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,(double)in_RDI);
    printKeyValue(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,(double)in_RDI);
    printKeyValue(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,(double)in_RDI);
    printKeyValue(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,(double)in_RDI);
    popObject(in_stack_ffffffffffffffb0);
    pSVar6 = ClaspFacade::Summary::ctx(in_RSI);
    uVar3 = SharedContext::concurrency(pSVar6);
    if (1 < uVar3) {
      pSVar6 = ClaspFacade::Summary::ctx(in_RSI);
      SharedContext::concurrency(pSVar6);
      printKeyValue(in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,0);
      pSVar6 = ClaspFacade::Summary::ctx(in_RSI);
      SharedContext::winner(pSVar6);
      printKeyValue(in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,0);
    }
  }
  return;
}

Assistant:

void JsonOutput::printSummary(const ClaspFacade::Summary& run, bool final) {
	popUntil(final ? 1u : 3u);
	const char* res = "UNKNOWN";
	if      (run.unsat()) { res = "UNSATISFIABLE"; }
	else if (run.sat())   { res = !run.optimum() ? "SATISFIABLE" : "OPTIMUM FOUND"; }
	printKeyValue("Result", res);
	if (verbosity()) {
		if (run.result.interrupted()){ printKeyValue(run.result.signal != SIGALRM ? "INTERRUPTED" : "TIME LIMIT", uint32(1));  }
		pushObject("Models");
		printKeyValue("Number", run.numEnum);
		printKeyValue("More"  , run.complete() ? "no" : "yes");
		if (run.sat()) {
			if (run.consequences()){
				printKeyValue(run.consequences(), run.complete() ? "yes":"unknown");
				printCons(numCons(run.ctx().output, *run.model()));
			}
			if (run.optimize())    {
				printKeyValue("Optimum", run.optimum()?"yes":"unknown");
				printKeyValue("Optimal", run.optimal());
				printCosts(*run.costs());
			}
		}
		popObject();
		if (run.hasLower() && !run.optimum()) {
			pushObject("Bounds");
			printCosts(run.lower(), "Lower");
			printCosts(run.costs() ? *run.costs() : SumVec(), "Upper");
			popObject();
		}
		if (final) { printKeyValue("Calls", run.step + 1); }
		pushObject("Time");
		printKeyValue("Total", run.totalTime);
		printKeyValue("Solve", run.solveTime);
		printKeyValue("Model", run.satTime);
		printKeyValue("Unsat", run.unsatTime);
		printKeyValue("CPU"  , run.cpuTime);
		popObject(); // Time
		if (run.ctx().concurrency() > 1) {
			printKeyValue("Threads", run.ctx().concurrency());
			printKeyValue("Winner",  run.ctx().winner());
		}
	}
}